

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_gej_neg(secp256k1_gej *r,secp256k1_gej *a)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  
  r->infinity = a->infinity;
  (r->x).n[4] = (a->x).n[4];
  uVar1 = (a->x).n[0];
  uVar2 = (a->x).n[1];
  uVar3 = (a->x).n[3];
  (r->x).n[2] = (a->x).n[2];
  (r->x).n[3] = uVar3;
  (r->x).n[0] = uVar1;
  (r->x).n[1] = uVar2;
  uVar1 = (a->y).n[1];
  uVar2 = (a->y).n[2];
  uVar3 = (a->y).n[3];
  (r->y).n[0] = (a->y).n[0];
  (r->y).n[1] = uVar1;
  (r->y).n[2] = uVar2;
  (r->y).n[3] = uVar3;
  (r->y).n[4] = (a->y).n[4];
  uVar1 = (a->z).n[1];
  uVar2 = (a->z).n[2];
  uVar3 = (a->z).n[3];
  (r->z).n[0] = (a->z).n[0];
  (r->z).n[1] = uVar1;
  (r->z).n[2] = uVar2;
  (r->z).n[3] = uVar3;
  (r->z).n[4] = (a->z).n[4];
  secp256k1_fe_impl_normalize_weak(&r->y);
  uVar1 = (r->y).n[1];
  uVar2 = (r->y).n[2];
  uVar3 = (r->y).n[3];
  (r->y).n[0] = 0x3ffffbfffff0bc - (r->y).n[0];
  (r->y).n[1] = 0x3ffffffffffffc - uVar1;
  (r->y).n[2] = 0x3ffffffffffffc - uVar2;
  (r->y).n[3] = 0x3ffffffffffffc - uVar3;
  (r->y).n[4] = 0x3fffffffffffc - (r->y).n[4];
  return;
}

Assistant:

static void secp256k1_gej_neg(secp256k1_gej *r, const secp256k1_gej *a) {
    SECP256K1_GEJ_VERIFY(a);

    r->infinity = a->infinity;
    r->x = a->x;
    r->y = a->y;
    r->z = a->z;
    secp256k1_fe_normalize_weak(&r->y);
    secp256k1_fe_negate(&r->y, &r->y, 1);

    SECP256K1_GEJ_VERIFY(r);
}